

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O1

void al_vertical_shear_transform(ALLEGRO_TRANSFORM *trans,float theta)

{
  float fVar1;
  
  fVar1 = tanf(theta);
  trans->m[0][1] = trans->m[0][0] * fVar1 + trans->m[0][1];
  trans->m[1][1] = trans->m[1][0] * fVar1 + trans->m[1][1];
  trans->m[3][1] = fVar1 * trans->m[3][0] + trans->m[3][1];
  return;
}

Assistant:

void al_vertical_shear_transform(ALLEGRO_TRANSFORM* trans, float theta)
{
   float s;
   ASSERT(trans);
   s = tanf(theta);

   trans->m[0][1] += trans->m[0][0] * s;
   trans->m[1][1] += trans->m[1][0] * s;
   trans->m[3][1] += trans->m[3][0] * s;
}